

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::generateBufferReferencedByShaderInterfaceBlockCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               ProgramResourceQueryTestTarget *queryTarget,bool extendedCases)

{
  NodeType NVar1;
  Variable *pVVar2;
  ArrayElement *pAVar3;
  Node *pNVar4;
  ResourceTestCase *pRVar5;
  LayoutQualifier *pLVar6;
  SharedPtr arrayElement;
  SharedPtr structMember;
  SharedPtr variable;
  SharedPtr variableArray;
  SharedPtr variableStruct;
  SharedPtr variableStruct_1;
  
  NVar1 = parentStructure->m_ptr->m_type;
  pVVar2 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(pVVar2,parentStructure,TYPE_FLOAT);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&variable,(Node *)pVVar2);
  pAVar3 = (ArrayElement *)operator_new(0x28);
  ResourceDefinition::ArrayElement::ArrayElement(pAVar3,parentStructure,-1);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&arrayElement,(Node *)pAVar3);
  pNVar4 = (Node *)operator_new(0x20);
  ResourceDefinition::StructMember::StructMember((StructMember *)pNVar4,parentStructure);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&structMember,pNVar4);
  pVVar2 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(pVVar2,&arrayElement,TYPE_FLOAT);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&variableArray,(Node *)pVVar2);
  pVVar2 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(pVVar2,&structMember,TYPE_FLOAT);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&variableStruct,(Node *)pVVar2);
  pRVar5 = (ResourceTestCase *)operator_new(0xb0);
  ResourceTestCase::ResourceTestCase(pRVar5,context,&variable,queryTarget,"float");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
  pRVar5 = (ResourceTestCase *)operator_new(0xb0);
  ResourceTestCase::ResourceTestCase(pRVar5,context,&variableArray,queryTarget,"float_array");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
  pRVar5 = (ResourceTestCase *)operator_new(0xb0);
  ResourceTestCase::ResourceTestCase(pRVar5,context,&variableStruct,queryTarget,"float_struct");
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&variableStruct);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&variableArray);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&structMember);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&arrayElement);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&variable);
  if (NVar1 != TYPE_INTERFACE_BLOCK) {
    pLVar6 = (LayoutQualifier *)operator_new(0x38);
    glu::Layout::Layout((Layout *)&variable,-1,0,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    ResourceDefinition::LayoutQualifier::LayoutQualifier(pLVar6,parentStructure,(Layout *)&variable)
    ;
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&arrayElement,(Node *)pLVar6);
    pVVar2 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar2,&arrayElement,TYPE_SAMPLER_2D);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,(Node *)pVVar2);
    pAVar3 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar3,&arrayElement,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&structMember,(Node *)pAVar3);
    pNVar4 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)pNVar4,parentStructure);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variableArray,pNVar4);
    pVVar2 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar2,&structMember,TYPE_SAMPLER_2D);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variableStruct,(Node *)pVVar2);
    pVVar2 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar2,&variableArray,TYPE_SAMPLER_2D);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variableStruct_1,(Node *)pVVar2);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar5,context,&variable,queryTarget,"sampler");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar5,context,&variableStruct,queryTarget,"sampler_array");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,&variableStruct_1,queryTarget,"sampler_struct");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variableStruct_1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variableStruct);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variableArray);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&structMember);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&arrayElement);
    pLVar6 = (LayoutQualifier *)operator_new(0x38);
    glu::Layout::Layout((Layout *)&variable,-1,0,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    ResourceDefinition::LayoutQualifier::LayoutQualifier(pLVar6,parentStructure,(Layout *)&variable)
    ;
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&arrayElement,(Node *)pLVar6);
    pVVar2 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar2,&arrayElement,TYPE_UINT_ATOMIC_COUNTER);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,(Node *)pVVar2);
    pAVar3 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar3,&arrayElement,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&structMember,(Node *)pAVar3);
    pVVar2 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar2,&structMember,TYPE_UINT_ATOMIC_COUNTER);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variableArray,(Node *)pVVar2);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar5,context,&variable,queryTarget,"atomic_uint");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,&variableArray,queryTarget,"atomic_uint_array");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variableArray);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&structMember);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&arrayElement);
  }
  if (extendedCases) {
    pNVar4 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)pNVar4,parentStructure);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,pNVar4);
    pAVar3 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar3,&variable,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&arrayElement,(Node *)pAVar3);
    pVVar2 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar2,&arrayElement,TYPE_FLOAT);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&structMember,(Node *)pVVar2);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,&structMember,queryTarget,"float_array_struct");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&structMember);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&arrayElement);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    pAVar3 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar3,parentStructure,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,(Node *)pAVar3);
    pNVar4 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)pNVar4,&variable);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&arrayElement,pNVar4);
    pVVar2 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar2,&arrayElement,TYPE_FLOAT);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&structMember,(Node *)pVVar2);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,&structMember,queryTarget,"float_struct_array");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&structMember);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&arrayElement);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    pAVar3 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar3,parentStructure,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,(Node *)pAVar3);
    pAVar3 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(pAVar3,&variable,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&arrayElement,(Node *)pAVar3);
    pVVar2 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar2,&arrayElement,TYPE_FLOAT);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&structMember,(Node *)pVVar2);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase(pRVar5,context,&structMember,queryTarget,"float_array_array")
    ;
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&structMember);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&arrayElement);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    pNVar4 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)pNVar4,parentStructure);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&variable,pNVar4);
    pNVar4 = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)pNVar4,&variable);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&arrayElement,pNVar4);
    pVVar2 = (Variable *)operator_new(0x28);
    ResourceDefinition::Variable::Variable(pVVar2,&arrayElement,TYPE_FLOAT);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&structMember,(Node *)pVVar2);
    pRVar5 = (ResourceTestCase *)operator_new(0xb0);
    ResourceTestCase::ResourceTestCase
              (pRVar5,context,&structMember,queryTarget,"float_struct_struct");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&structMember);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&arrayElement);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&variable);
    if (queryTarget->interface == PROGRAMINTERFACE_BUFFER_VARIABLE) {
      pAVar3 = (ArrayElement *)operator_new(0x28);
      ResourceDefinition::ArrayElement::ArrayElement(pAVar3,parentStructure,-2);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&variable,(Node *)pAVar3);
      pVVar2 = (Variable *)operator_new(0x28);
      ResourceDefinition::Variable::Variable(pVVar2,&variable,TYPE_FLOAT);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&arrayElement,(Node *)pVVar2);
      pRVar5 = (ResourceTestCase *)operator_new(0xb0);
      ResourceTestCase::ResourceTestCase
                (pRVar5,context,&arrayElement,queryTarget,"float_unsized_array");
      tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr(&arrayElement);
      pNVar4 = (Node *)operator_new(0x20);
      ResourceDefinition::StructMember::StructMember((StructMember *)pNVar4,&variable);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&arrayElement,pNVar4);
      pVVar2 = (Variable *)operator_new(0x28);
      ResourceDefinition::Variable::Variable(pVVar2,&arrayElement,TYPE_FLOAT);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&structMember,(Node *)pVVar2);
      pRVar5 = (ResourceTestCase *)operator_new(0xb0);
      ResourceTestCase::ResourceTestCase
                (pRVar5,context,&structMember,queryTarget,"float_unsized_struct_array");
      tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)pRVar5);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr(&structMember);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr(&arrayElement);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::~SharedPtr(&variable);
    }
  }
  return;
}

Assistant:

static void generateBufferReferencedByShaderInterfaceBlockCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup, const ProgramResourceQueryTestTarget& queryTarget, bool extendedCases)
{
	const bool isDefaultBlock = (parentStructure->getType() != ResourceDefinition::Node::TYPE_INTERFACE_BLOCK);

	// .float
	// .float_array
	// .float_struct
	{
		const ResourceDefinition::Node::SharedPtr	variable		(new ResourceDefinition::Variable(parentStructure, glu::TYPE_FLOAT));
		const ResourceDefinition::Node::SharedPtr	arrayElement	(new ResourceDefinition::ArrayElement(parentStructure));
		const ResourceDefinition::Node::SharedPtr	structMember	(new ResourceDefinition::StructMember(parentStructure));
		const ResourceDefinition::Node::SharedPtr	variableArray	(new ResourceDefinition::Variable(arrayElement, glu::TYPE_FLOAT));
		const ResourceDefinition::Node::SharedPtr	variableStruct	(new ResourceDefinition::Variable(structMember, glu::TYPE_FLOAT));

		targetGroup->addChild(new ResourceTestCase(context, variable, queryTarget, "float"));
		targetGroup->addChild(new ResourceTestCase(context, variableArray, queryTarget, "float_array"));
		targetGroup->addChild(new ResourceTestCase(context, variableStruct, queryTarget, "float_struct"));
	}

	// .sampler
	// .sampler_array
	// .sampler_struct
	if (isDefaultBlock)
	{
		const ResourceDefinition::Node::SharedPtr	layout			(new ResourceDefinition::LayoutQualifier(parentStructure, glu::Layout(-1, 0)));
		const ResourceDefinition::Node::SharedPtr	variable		(new ResourceDefinition::Variable(layout, glu::TYPE_SAMPLER_2D));
		const ResourceDefinition::Node::SharedPtr	arrayElement	(new ResourceDefinition::ArrayElement(layout));
		const ResourceDefinition::Node::SharedPtr	structMember	(new ResourceDefinition::StructMember(parentStructure));
		const ResourceDefinition::Node::SharedPtr	variableArray	(new ResourceDefinition::Variable(arrayElement, glu::TYPE_SAMPLER_2D));
		const ResourceDefinition::Node::SharedPtr	variableStruct	(new ResourceDefinition::Variable(structMember, glu::TYPE_SAMPLER_2D));

		targetGroup->addChild(new ResourceTestCase(context, variable, queryTarget, "sampler"));
		targetGroup->addChild(new ResourceTestCase(context, variableArray, queryTarget, "sampler_array"));
		targetGroup->addChild(new ResourceTestCase(context, variableStruct, queryTarget, "sampler_struct"));
	}

	// .atomic_uint
	// .atomic_uint_array
	if (isDefaultBlock)
	{
		const ResourceDefinition::Node::SharedPtr	layout			(new ResourceDefinition::LayoutQualifier(parentStructure, glu::Layout(-1, 0)));
		const ResourceDefinition::Node::SharedPtr	variable		(new ResourceDefinition::Variable(layout, glu::TYPE_UINT_ATOMIC_COUNTER));
		const ResourceDefinition::Node::SharedPtr	arrayElement	(new ResourceDefinition::ArrayElement(layout));
		const ResourceDefinition::Node::SharedPtr	variableArray	(new ResourceDefinition::Variable(arrayElement, glu::TYPE_UINT_ATOMIC_COUNTER));

		targetGroup->addChild(new ResourceTestCase(context, variable, queryTarget, "atomic_uint"));
		targetGroup->addChild(new ResourceTestCase(context, variableArray, queryTarget, "atomic_uint_array"));
	}

	if (extendedCases)
	{
		// .float_array_struct
		{
			const ResourceDefinition::Node::SharedPtr	structMember		(new ResourceDefinition::StructMember(parentStructure));
			const ResourceDefinition::Node::SharedPtr	arrayElement		(new ResourceDefinition::ArrayElement(structMember));
			const ResourceDefinition::Node::SharedPtr	variableArrayStruct	(new ResourceDefinition::Variable(arrayElement, glu::TYPE_FLOAT));

			targetGroup->addChild(new ResourceTestCase(context, variableArrayStruct, queryTarget, "float_array_struct"));
		}

		// .float_struct_array
		{
			const ResourceDefinition::Node::SharedPtr	arrayElement		(new ResourceDefinition::ArrayElement(parentStructure));
			const ResourceDefinition::Node::SharedPtr	arrayStructMember	(new ResourceDefinition::StructMember(arrayElement));
			const ResourceDefinition::Node::SharedPtr	variableArrayStruct	(new ResourceDefinition::Variable(arrayStructMember, glu::TYPE_FLOAT));

			targetGroup->addChild(new ResourceTestCase(context, variableArrayStruct, queryTarget, "float_struct_array"));
		}

		// .float_array_array
		{
			const ResourceDefinition::Node::SharedPtr	arrayElement		(new ResourceDefinition::ArrayElement(parentStructure));
			const ResourceDefinition::Node::SharedPtr	subArrayElement		(new ResourceDefinition::ArrayElement(arrayElement));
			const ResourceDefinition::Node::SharedPtr	variableArrayStruct	(new ResourceDefinition::Variable(subArrayElement, glu::TYPE_FLOAT));

			targetGroup->addChild(new ResourceTestCase(context, variableArrayStruct, queryTarget, "float_array_array"));
		}

		// .float_struct_struct
		{
			const ResourceDefinition::Node::SharedPtr	structMember		(new ResourceDefinition::StructMember(parentStructure));
			const ResourceDefinition::Node::SharedPtr	subStructMember		(new ResourceDefinition::StructMember(structMember));
			const ResourceDefinition::Node::SharedPtr	variableArrayStruct	(new ResourceDefinition::Variable(subStructMember, glu::TYPE_FLOAT));

			targetGroup->addChild(new ResourceTestCase(context, variableArrayStruct, queryTarget, "float_struct_struct"));
		}

		if (queryTarget.interface == PROGRAMINTERFACE_BUFFER_VARIABLE)
		{
			const ResourceDefinition::Node::SharedPtr arrayElement(new ResourceDefinition::ArrayElement(parentStructure, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));

			// .float_unsized_array
			{
				const ResourceDefinition::Node::SharedPtr	variableArray	(new ResourceDefinition::Variable(arrayElement, glu::TYPE_FLOAT));

				targetGroup->addChild(new ResourceTestCase(context, variableArray, queryTarget, "float_unsized_array"));
			}

			// .float_unsized_struct_array
			{
				const ResourceDefinition::Node::SharedPtr	structMember	(new ResourceDefinition::StructMember(arrayElement));
				const ResourceDefinition::Node::SharedPtr	variableArray	(new ResourceDefinition::Variable(structMember, glu::TYPE_FLOAT));

				targetGroup->addChild(new ResourceTestCase(context, variableArray, queryTarget, "float_unsized_struct_array"));
			}
		}
	}
}